

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::DeformableConv2D_x86_avx512::create_pipeline(DeformableConv2D_x86_avx512 *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  _func_int **pp_Var4;
  Layer *pLVar5;
  ParamDictPrivate **ppPVar6;
  undefined8 in_RSI;
  long *in_RDI;
  bool bVar7;
  ParamDict permute_pd;
  Mat weights [2];
  ParamDict pd;
  int j;
  int i;
  float *outptr;
  Mat m;
  int q;
  Mat weight_3d;
  int in_c;
  Mat *m_2;
  Mat *m_1;
  ParamDict *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  undefined4 in_stack_fffffffffffff950;
  int in_stack_fffffffffffff954;
  Mat *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  int in_stack_fffffffffffff964;
  undefined8 in_stack_fffffffffffff968;
  void **ppvVar8;
  Mat *in_stack_fffffffffffff970;
  ParamDict *pPVar9;
  ParamDict *local_678;
  Allocator *in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  ParamDict *pPVar10;
  Mat *in_stack_fffffffffffff9c8;
  ParamDict *local_620;
  Allocator *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  Mat *in_stack_fffffffffffffa48;
  ParamDict local_578;
  undefined1 local_568 [16];
  ParamDict local_558 [2];
  long *local_538;
  void *local_510;
  int *local_508;
  void *local_500;
  undefined4 local_4f8;
  long *local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  void *local_4d0;
  ParamDict local_4c8;
  void *local_4b8;
  int *local_4b0;
  undefined8 local_4a8;
  undefined4 local_4a0;
  long *local_498;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined8 local_478;
  int local_470;
  int local_46c;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined4 local_450;
  long local_448;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined8 local_428;
  undefined4 *local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined4 local_400;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  int local_3cc;
  int local_3c8;
  void *local_3b8;
  int *local_3b0;
  long local_3a8;
  undefined4 local_3a0;
  long *local_398;
  undefined4 local_390;
  int local_38c;
  int local_388;
  undefined4 local_384;
  undefined4 local_380;
  long local_378;
  int local_36c;
  undefined8 local_368;
  int local_354;
  ParamDict *local_350;
  long *local_348;
  undefined1 local_33d;
  int local_33c;
  long *local_338;
  undefined8 *local_330;
  undefined1 local_325;
  int local_324;
  void **local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_2f8;
  undefined8 *local_2e8;
  void **local_2d8;
  ParamDictPrivate **local_2c0;
  void **local_2b0;
  int local_29c;
  undefined8 *local_298;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  int local_260;
  undefined4 local_25c;
  ParamDictPrivate **local_258;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  undefined8 *local_208;
  undefined8 *local_1e8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  void **local_1a0;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int local_180;
  undefined4 local_17c;
  ParamDict *local_178;
  ParamDict *local_170;
  ParamDict *local_168;
  int local_160;
  undefined4 local_15c;
  ParamDict *local_158;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  void **local_140;
  void **local_138;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  long *local_120;
  void *local_100;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 *local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  undefined4 local_a4;
  long local_a0;
  undefined4 local_94;
  long local_90;
  void *local_88;
  ParamDictPrivate *local_20;
  void *local_10;
  
  lVar1 = *(long *)(*in_RDI + -0x18);
  local_36c = *(int *)((long)in_RDI + lVar1 + 0x100) /
              (*(int *)((long)in_RDI + lVar1 + 0xd0) * *(int *)((long)in_RDI + lVar1 + 0xd8) *
              *(int *)((long)in_RDI + lVar1 + 0xd4));
  local_368 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffa48,(int)((ulong)in_stack_fffffffffffffa40 >> 0x20),
               (int)in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
               in_stack_fffffffffffffa30);
  Mat::create(in_stack_fffffffffffff970,(int)((ulong)in_stack_fffffffffffff968 >> 0x20),
              (int)in_stack_fffffffffffff968,in_stack_fffffffffffff964,
              (size_t)in_stack_fffffffffffff958,
              (Allocator *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
  local_348 = in_RDI + 1;
  bVar7 = true;
  if (*local_348 != 0) {
    bVar7 = in_RDI[9] * (long)(int)in_RDI[8] == 0;
    local_120 = local_348;
  }
  if (bVar7) {
    local_354 = -100;
    local_3c8 = 1;
  }
  else {
    for (local_3cc = 0; local_3cc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_3cc = local_3cc + 1) {
      local_318 = &local_418;
      local_320 = &local_3b8;
      local_100 = (void *)((long)local_3b8 + local_378 * local_3cc * local_3a8);
      local_e8 = &local_418;
      local_90 = (long)local_38c * (long)local_388 * local_3a8;
      local_338 = in_RDI + 1;
      local_330 = &local_468;
      local_b4 = *(int *)((long)in_RDI + 0x34);
      local_b8 = (int)in_RDI[7];
      local_bc = *(undefined4 *)((long)in_RDI + 0x3c);
      local_c8 = (undefined4 *)(*local_338 + in_RDI[9] * (long)local_3cc * in_RDI[3]);
      local_d0 = in_RDI[3];
      local_d4 = (undefined4)in_RDI[4];
      local_e0 = in_RDI[5];
      local_b0 = &local_468;
      local_a0 = (long)local_b4 * (long)local_b8 * local_d0;
      local_310 = &local_468;
      local_2f8 = &local_468;
      local_94 = 0x10;
      local_a4 = 0x10;
      local_324 = local_3cc;
      local_325 = 1;
      local_33c = local_3cc;
      local_33d = 1;
      local_468 = 0;
      local_458 = 0;
      local_450 = 0;
      local_440 = 0;
      local_43c = 0;
      local_438 = 0;
      local_434 = 0;
      local_430 = 0;
      local_428 = 0;
      local_460 = 0;
      local_420 = local_c8;
      for (local_46c = 0;
          local_46c <
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8); local_46c = local_46c + 1) {
        for (local_470 = 0; local_470 < local_36c; local_470 = local_470 + 1) {
          local_29c = local_470;
          local_298 = &local_418;
          *local_420 = *(undefined4 *)
                        ((long)local_100 +
                        (long)local_46c * 4 + (long)local_38c * (long)local_470 * local_3a8);
          local_420 = local_420 + 1;
        }
      }
      local_2e8 = &local_418;
      local_418 = 0;
      local_408 = 0;
      local_400 = 0;
      local_3f0 = 0;
      local_3ec = 0;
      local_3e8 = 0;
      local_3e4 = 0;
      local_3e0 = 0;
      local_3d8 = 0;
      local_410 = 0;
      local_208 = local_2e8;
      local_1e8 = local_2f8;
      local_448 = local_e0;
    }
    local_1b8 = &local_3b8;
    if (local_3b0 != (int *)0x0) {
      local_1bc = 0xffffffff;
      LOCK();
      local_1c0 = *local_3b0;
      *local_3b0 = *local_3b0 + -1;
      UNLOCK();
      if (local_1c0 == 1) {
        if (local_398 == (long *)0x0) {
          if (local_3b8 != (void *)0x0) {
            free(local_3b8);
          }
        }
        else {
          (**(code **)(*local_398 + 0x18))(local_398,local_3b8);
        }
      }
    }
    local_3b8 = (void *)0x0;
    local_3a8 = 0;
    local_3a0 = 0;
    local_390 = 0;
    local_38c = 0;
    local_388 = 0;
    local_384 = 0;
    local_380 = 0;
    local_378 = 0;
    local_3b0 = (int *)0x0;
    Mat::reshape(in_stack_fffffffffffff9c8,(int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                 (int)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    ppvVar8 = (void **)(in_RDI + 1);
    local_148 = &local_4b8;
    local_140 = ppvVar8;
    if (ppvVar8 != local_148) {
      if (local_4b0 != (int *)0x0) {
        local_14c = 1;
        LOCK();
        local_150 = *local_4b0;
        *local_4b0 = *local_4b0 + 1;
        UNLOCK();
      }
      local_128 = ppvVar8;
      if (in_RDI[2] != 0) {
        piVar2 = (int *)in_RDI[2];
        local_12c = 0xffffffff;
        LOCK();
        local_130 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (local_130 == 1) {
          if (in_RDI[5] == 0) {
            local_88 = *ppvVar8;
            if (local_88 != (void *)0x0) {
              free(local_88);
            }
          }
          else {
            (**(code **)(*(long *)in_RDI[5] + 0x18))();
          }
        }
      }
      *ppvVar8 = (void *)0x0;
      in_RDI[3] = 0;
      *(undefined4 *)(in_RDI + 4) = 0;
      *(undefined4 *)(in_RDI + 6) = 0;
      *(undefined4 *)((long)in_RDI + 0x34) = 0;
      *(undefined4 *)(in_RDI + 7) = 0;
      *(undefined4 *)((long)in_RDI + 0x3c) = 0;
      *(undefined4 *)(in_RDI + 8) = 0;
      in_RDI[9] = 0;
      in_RDI[2] = 0;
      *ppvVar8 = *local_148;
      in_RDI[2] = (long)local_148[1];
      in_RDI[3] = (long)local_148[2];
      *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(local_148 + 3);
      in_RDI[5] = (long)local_148[4];
      *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(local_148 + 5);
      *(undefined4 *)((long)in_RDI + 0x34) = *(undefined4 *)((long)local_148 + 0x2c);
      *(undefined4 *)(in_RDI + 7) = *(undefined4 *)(local_148 + 6);
      *(undefined4 *)((long)in_RDI + 0x3c) = *(undefined4 *)((long)local_148 + 0x34);
      *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(local_148 + 7);
      in_RDI[9] = (long)local_148[8];
    }
    local_2d8 = &local_4b8;
    local_228 = local_2d8;
    local_138 = ppvVar8;
    if (local_4b0 != (int *)0x0) {
      local_22c = 0xffffffff;
      LOCK();
      local_230 = *local_4b0;
      *local_4b0 = *local_4b0 + -1;
      UNLOCK();
      if (local_230 == 1) {
        if (local_498 == (long *)0x0) {
          if (local_4b8 != (void *)0x0) {
            free(local_4b8);
          }
        }
        else {
          (**(code **)(*local_498 + 0x18))();
        }
      }
    }
    local_4b8 = (void *)0x0;
    local_4a8 = 0;
    local_4a0 = 0;
    local_490 = 0;
    local_48c = 0;
    local_488 = 0;
    local_484 = 0;
    local_480 = 0;
    local_478 = 0;
    local_4b0 = (int *)0x0;
    pLVar5 = create_layer(in_stack_fffffffffffff94c);
    in_RDI[10] = (long)pLVar5;
    ParamDict::ParamDict((ParamDict *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
    ;
    ParamDict::set(&local_4c8,0,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
    ParamDict::set(&local_4c8,1,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc));
    ParamDict::set(&local_4c8,2,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
    ParamDict::set(&local_4c8,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104));
    ParamDict::set((ParamDict *)in_stack_fffffffffffff958,in_stack_fffffffffffff954,
                   (Mat *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    (**(code **)(*(long *)in_RDI[10] + 0x10))((long *)in_RDI[10],&local_4c8);
    local_620 = local_558;
    do {
      local_350 = local_620;
      local_620->_vptr_ParamDict = (_func_int **)0x0;
      local_620->d = (ParamDictPrivate *)0x0;
      local_620[1]._vptr_ParamDict = (_func_int **)0x0;
      *(undefined4 *)&local_620[1].d = 0;
      local_620[2]._vptr_ParamDict = (_func_int **)0x0;
      *(undefined4 *)&local_620[2].d = 0;
      *(undefined4 *)((long)&local_620[2].d + 4) = 0;
      *(undefined4 *)&local_620[3]._vptr_ParamDict = 0;
      *(undefined4 *)((long)&local_620[3]._vptr_ParamDict + 4) = 0;
      *(undefined4 *)&local_620[3].d = 0;
      local_620[4]._vptr_ParamDict = (_func_int **)0x0;
      local_620 = (ParamDict *)&local_620[4].d;
    } while (local_620 != &local_4c8);
    local_178 = (ParamDict *)(in_RDI + 1);
    pPVar9 = local_558;
    local_170 = pPVar9;
    if (pPVar9 != local_178) {
      if (in_RDI[2] != 0) {
        piVar2 = (int *)in_RDI[2];
        local_17c = 1;
        LOCK();
        local_180 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      pPVar10 = pPVar9;
      local_158 = pPVar9;
      if (local_558[0].d != (ParamDictPrivate *)0x0) {
        local_15c = 0xffffffff;
        LOCK();
        local_160 = (local_558[0].d)->params[0].type;
        (local_558[0].d)->params[0].type = (local_558[0].d)->params[0].type + -1;
        UNLOCK();
        if (local_160 == 1) {
          if (local_538 == (long *)0x0) {
            if (local_558[0]._vptr_ParamDict != (_func_int **)0x0) {
              free(local_558[0]._vptr_ParamDict);
            }
          }
          else {
            (**(code **)(*local_538 + 0x18))(local_538,local_558[0]._vptr_ParamDict);
          }
        }
      }
      pPVar9->_vptr_ParamDict = (_func_int **)0x0;
      pPVar9[1]._vptr_ParamDict = (_func_int **)0x0;
      *(undefined4 *)&pPVar9[1].d = 0;
      *(undefined4 *)&pPVar9[2].d = 0;
      *(undefined4 *)((long)&pPVar9[2].d + 4) = 0;
      *(undefined4 *)&pPVar9[3]._vptr_ParamDict = 0;
      *(undefined4 *)((long)&pPVar9[3]._vptr_ParamDict + 4) = 0;
      *(undefined4 *)&pPVar9[3].d = 0;
      pPVar9[4]._vptr_ParamDict = (_func_int **)0x0;
      pPVar9->d = (ParamDictPrivate *)0x0;
      pPVar10->_vptr_ParamDict = local_178->_vptr_ParamDict;
      pPVar10->d = local_178->d;
      pPVar10[1]._vptr_ParamDict = local_178[1]._vptr_ParamDict;
      *(undefined4 *)&pPVar10[1].d = *(undefined4 *)&local_178[1].d;
      pPVar10[2]._vptr_ParamDict = local_178[2]._vptr_ParamDict;
      *(undefined4 *)&pPVar10[2].d = *(undefined4 *)&local_178[2].d;
      *(undefined4 *)((long)&pPVar10[2].d + 4) = *(undefined4 *)((long)&local_178[2].d + 4);
      *(undefined4 *)&pPVar10[3]._vptr_ParamDict = *(undefined4 *)&local_178[3]._vptr_ParamDict;
      *(undefined4 *)((long)&pPVar10[3]._vptr_ParamDict + 4) =
           *(undefined4 *)((long)&local_178[3]._vptr_ParamDict + 4);
      *(undefined4 *)&pPVar10[3].d = *(undefined4 *)&local_178[3].d;
      pPVar10[4]._vptr_ParamDict = local_178[4]._vptr_ParamDict;
      pPVar9 = pPVar10;
    }
    local_168 = pPVar9;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) != 0) {
      lVar1 = *(long *)(*in_RDI + -0x18);
      local_1a8 = (void **)((long)in_RDI + lVar1 + 0x198);
      local_1a0 = &local_510;
      local_198 = &local_510;
      if (&local_510 != local_1a8) {
        if (*(long *)((long)in_RDI + lVar1 + 0x1a0) != 0) {
          piVar2 = *(int **)((long)in_RDI + lVar1 + 0x1a0);
          local_1ac = 1;
          LOCK();
          local_1b0 = *piVar2;
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_188 = &local_510;
        if (local_508 != (int *)0x0) {
          local_18c = 0xffffffff;
          LOCK();
          local_190 = *local_508;
          *local_508 = *local_508 + -1;
          UNLOCK();
          if (local_190 == 1) {
            if (local_4f0 == (long *)0x0) {
              if (local_510 != (void *)0x0) {
                free(local_510);
              }
            }
            else {
              (**(code **)(*local_4f0 + 0x18))(local_4f0,local_510);
            }
          }
        }
        local_510 = *local_1a8;
        local_508 = (int *)local_1a8[1];
        local_500 = local_1a8[2];
        local_4f8 = *(undefined4 *)(local_1a8 + 3);
        local_4f0 = (long *)local_1a8[4];
        local_4e8 = *(undefined4 *)(local_1a8 + 5);
        local_4e4 = *(undefined4 *)((long)local_1a8 + 0x2c);
        local_4e0 = *(undefined4 *)(local_1a8 + 6);
        local_4dc = *(undefined4 *)((long)local_1a8 + 0x34);
        local_4d8 = *(undefined4 *)(local_1a8 + 7);
        local_4d0 = local_1a8[8];
      }
    }
    plVar3 = (long *)in_RDI[10];
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960)
               ,in_stack_fffffffffffff958);
    (**(code **)(*plVar3 + 0x18))(plVar3,local_568);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff940);
    (**(code **)(*(long *)in_RDI[10] + 0x20))();
    pLVar5 = create_layer(in_stack_fffffffffffff94c);
    in_RDI[0xb] = (long)pLVar5;
    ParamDict::ParamDict((ParamDict *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
    ;
    ParamDict::set(&local_578,0,1);
    (**(code **)(*(long *)in_RDI[0xb] + 0x10))((long *)in_RDI[0xb],&local_578);
    (**(code **)(*(long *)in_RDI[0xb] + 0x20))((long *)in_RDI[0xb],local_368);
    ParamDict::~ParamDict(in_stack_fffffffffffff940);
    local_678 = &local_4c8;
    do {
      ppPVar6 = &local_678[-5].d;
      pPVar9 = (ParamDict *)ppPVar6;
      local_2c0 = ppPVar6;
      local_258 = ppPVar6;
      if (local_678[-4]._vptr_ParamDict != (_func_int **)0x0) {
        pp_Var4 = local_678[-4]._vptr_ParamDict;
        local_25c = 0xffffffff;
        LOCK();
        local_260 = *(int *)pp_Var4;
        *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
        UNLOCK();
        if (local_260 == 1) {
          if (local_678[-3].d == (ParamDictPrivate *)0x0) {
            local_20 = *ppPVar6;
            if (local_20 != (ParamDictPrivate *)0x0) {
              free(local_20);
            }
          }
          else {
            (**(code **)(*(long *)(local_678[-3].d)->params + 0x18))(local_678[-3].d,*ppPVar6);
          }
        }
      }
      *ppPVar6 = (ParamDictPrivate *)0x0;
      local_678[-4].d = (ParamDictPrivate *)0x0;
      *(undefined4 *)&local_678[-3]._vptr_ParamDict = 0;
      *(undefined4 *)&local_678[-2]._vptr_ParamDict = 0;
      *(undefined4 *)((long)&local_678[-2]._vptr_ParamDict + 4) = 0;
      *(undefined4 *)&local_678[-2].d = 0;
      *(undefined4 *)((long)&local_678[-2].d + 4) = 0;
      *(undefined4 *)&local_678[-1]._vptr_ParamDict = 0;
      local_678[-1].d = (ParamDictPrivate *)0x0;
      local_678[-4]._vptr_ParamDict = (_func_int **)0x0;
      local_678 = pPVar9;
    } while (pPVar9 != local_558);
    ParamDict::~ParamDict(in_stack_fffffffffffff940);
    local_3c8 = 0;
  }
  ppvVar8 = &local_3b8;
  if (local_3b0 != (int *)0x0) {
    local_27c = 0xffffffff;
    LOCK();
    local_280 = *local_3b0;
    *local_3b0 = *local_3b0 + -1;
    UNLOCK();
    if (local_280 == 1) {
      local_2b0 = ppvVar8;
      local_278 = ppvVar8;
      if (local_398 == (long *)0x0) {
        local_10 = local_3b8;
        if (local_3b8 != (void *)0x0) {
          free(local_3b8);
        }
      }
      else {
        (**(code **)(*local_398 + 0x18))(local_398,local_3b8);
      }
    }
  }
  *ppvVar8 = (void *)0x0;
  ppvVar8[2] = (void *)0x0;
  *(undefined4 *)(ppvVar8 + 3) = 0;
  *(undefined4 *)(ppvVar8 + 5) = 0;
  *(undefined4 *)((long)ppvVar8 + 0x2c) = 0;
  *(undefined4 *)(ppvVar8 + 6) = 0;
  *(undefined4 *)((long)ppvVar8 + 0x34) = 0;
  *(undefined4 *)(ppvVar8 + 7) = 0;
  ppvVar8[8] = (void *)0x0;
  ppvVar8[1] = (void *)0x0;
  if (local_3c8 == 0) {
    local_354 = 0;
  }
  return local_354;
}

Assistant:

int DeformableConv2D_x86_avx512::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}